

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O0

void av1_qm_init(CommonQuantParams *quant_params,int num_planes)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int in_ESI;
  long in_RDI;
  int qm_tx_size;
  int size;
  int t;
  int current;
  int c;
  int q;
  uint local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      local_18 = 0;
      for (local_1c = 0; (int)local_1c < 0x13; local_1c = local_1c + 1) {
        iVar1 = tx_size_2d[(int)local_1c];
        bVar2 = av1_get_adjusted_tx_size((TX_SIZE)local_1c);
        uVar3 = (uint)bVar2;
        if (local_10 == 0xf) {
          *(undefined8 *)(in_RDI + 0x37b8 + (long)local_14 * 0x98 + (long)(int)local_1c * 8) = 0;
          *(undefined8 *)(in_RDI + 0x1b38 + (long)local_14 * 0x98 + (long)(int)local_1c * 8) = 0;
        }
        else if (local_1c == uVar3) {
          *(qm_val_t **)
           (in_RDI + 0x1d00 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 +
           (long)(int)local_1c * 8) = wt_matrix_ref[local_10][(int)(uint)(0 < local_14)] + local_18;
          *(qm_val_t **)
           (in_RDI + 0x80 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 + (long)(int)local_1c * 8
           ) = iwt_matrix_ref[local_10][(int)(uint)(0 < local_14)] + local_18;
          local_18 = iVar1 + local_18;
        }
        else {
          *(undefined8 *)
           (in_RDI + 0x1d00 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 +
           (long)(int)local_1c * 8) =
               *(undefined8 *)
                (in_RDI + 0x1d00 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 +
                (long)(int)uVar3 * 8);
          *(undefined8 *)
           (in_RDI + 0x80 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 + (long)(int)local_1c * 8
           ) = *(undefined8 *)
                (in_RDI + 0x80 + (long)local_10 * 0x1c8 + (long)local_14 * 0x98 +
                (long)(int)uVar3 * 8);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_qm_init(CommonQuantParams *quant_params, int num_planes) {
#if CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
  for (int q = 0; q < NUM_QM_LEVELS; ++q) {
    for (int c = 0; c < num_planes; ++c) {
      int current = 0;
      for (int t = 0; t < TX_SIZES_ALL; ++t) {
        const int size = tx_size_2d[t];
        const int qm_tx_size = av1_get_adjusted_tx_size(t);
        if (q == NUM_QM_LEVELS - 1) {
          quant_params->gqmatrix[q][c][t] = NULL;
          quant_params->giqmatrix[q][c][t] = NULL;
        } else if (t != qm_tx_size) {  // Reuse matrices for 'qm_tx_size'
          assert(t > qm_tx_size);
          quant_params->gqmatrix[q][c][t] =
              quant_params->gqmatrix[q][c][qm_tx_size];
          quant_params->giqmatrix[q][c][t] =
              quant_params->giqmatrix[q][c][qm_tx_size];
        } else {
          assert(current + size <= QM_TOTAL_SIZE);
          quant_params->gqmatrix[q][c][t] = &wt_matrix_ref[q][c >= 1][current];
          quant_params->giqmatrix[q][c][t] =
              &iwt_matrix_ref[q][c >= 1][current];
          current += size;
        }
      }
    }
  }
#else
  (void)quant_params;
  (void)num_planes;
#endif  // CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
}